

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_block_manager.hpp
# Opt level: O2

void __thiscall duckdb::InMemoryBlockManager::Read(InMemoryBlockManager *this,Block *block)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Cannot perform IO in in-memory database - Read!",&local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Read(Block &block) override {
		throw InternalException("Cannot perform IO in in-memory database - Read!");
	}